

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

void __thiscall CVmHashTable::move_entries_to(CVmHashTable *this,CVmHashTable *new_tab)

{
  CVmHashEntry *pCVar1;
  undefined8 *in_RDI;
  CVmHashEntry *nxt;
  CVmHashEntry *entry;
  size_t i;
  CVmHashEntry **tableptr;
  CVmHashEntry *entry_00;
  CVmHashTable *this_00;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)*in_RDI;
  for (this_00 = (CVmHashTable *)0x0; this_00 < (CVmHashTable *)in_RDI[1];
      this_00 = (CVmHashTable *)((long)&this_00->table_ + 1)) {
    entry_00 = (CVmHashEntry *)*local_18;
    while (entry_00 != (CVmHashEntry *)0x0) {
      pCVar1 = entry_00->nxt_;
      entry_00->nxt_ = (CVmHashEntry *)0x0;
      add(this_00,entry_00);
      entry_00 = pCVar1;
    }
    *local_18 = 0;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void CVmHashTable::move_entries_to(CVmHashTable *new_tab)
{
    CVmHashEntry **tableptr;
    size_t i;

    /* go through each hash value */
    for (tableptr = table_, i = 0 ; i < table_size_ ; ++i, ++tableptr)
    {
        CVmHashEntry *entry;
        CVmHashEntry *nxt;

        /* go through each entry at this hash value */
        for (entry = *tableptr ; entry ; entry = nxt)
        {
            /* 
             *   remember the next entry, since we'll be unlinking it from
             *   this table, which will render the nxt_ member unusable
             *   for the purposes of completing this enumeration 
             */
            nxt = entry->nxt_;

            /* 
             *   clear the 'next' pointer in this entry, to unlink it from
             *   our table - since everything is being removed, there's no
             *   need to worry about what came before us 
             */
            entry->nxt_ = 0;

            /* add the entry to the new hash table */
            new_tab->add(entry);
        }

        /* 
         *   clear this hash value chain head - we've now removed
         *   everything from it 
         */
        *tableptr = 0;
    }
}